

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void MeCab::enum_csv_dictionaries
               (char *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics)

{
  bool bVar1;
  DIR *__dirp;
  ostream *poVar2;
  dirent *pdVar3;
  allocator local_c1;
  char *local_c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b8;
  string tmp;
  string local_90;
  string local_70;
  string ext;
  
  local_b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dics;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(dics);
  local_c0 = path;
  __dirp = opendir(path);
  if (__dirp == (DIR *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/utils.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xed);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"dir");
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"no such directory: ");
    std::operator<<(poVar2,local_c0);
    die::~die((die *)&tmp);
  }
  pdVar3 = readdir(__dirp);
  while (pdVar3 != (dirent *)0x0) {
    std::__cxx11::string::string((string *)&tmp,pdVar3->d_name,(allocator *)&ext);
    if (4 < tmp._M_string_length) {
      std::__cxx11::string::substr((ulong)&ext,(ulong)&tmp);
      toLower(&ext);
      bVar1 = std::operator==(&ext,".csv");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_90,local_c0,&local_c1);
        create_filename(&local_70,&local_90,&tmp);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_b8,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::~string((string *)&ext);
    }
    std::__cxx11::string::~string((string *)&tmp);
    pdVar3 = readdir(__dirp);
  }
  closedir(__dirp);
  return;
}

Assistant:

void enum_csv_dictionaries(const char *path,
                           std::vector<std::string> *dics) {
  dics->clear();

#if defined(_WIN32) && !defined(__CYGWIN__)
  WIN32_FIND_DATAW wfd;
  HANDLE hFind;
  const std::wstring pat = Utf8ToWide(create_filename(path, "*.csv"));
  hFind = ::FindFirstFileW(pat.c_str(), &wfd);
  CHECK_DIE(hFind != INVALID_HANDLE_VALUE)
      << "Invalid File Handle. Get Last Error reports";
  do {
    std::string tmp = create_filename(path, WideToUtf8(wfd.cFileName));
    dics->push_back(tmp);
  } while (::FindNextFileW(hFind, &wfd));
  ::FindClose(hFind);
#else
  DIR *dir = opendir(path);
  CHECK_DIE(dir) << "no such directory: " << path;

  for (struct dirent *dp = readdir(dir);
       dp;
       dp = readdir(dir)) {
    const std::string tmp = dp->d_name;
    if (tmp.size() >= 5) {
      std::string ext = tmp.substr(tmp.size() - 4, 4);
      toLower(&ext);
      if (ext == ".csv") {
        dics->push_back(create_filename(path, tmp));
      }
    }
  }
  closedir(dir);
#endif
}